

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void __thiscall comparer_context::EOFActual(comparer_context *this)

{
  compare_fails_exception *this_00;
  ostream *poVar1;
  stringstream ss;
  char *local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = (compare_fails_exception *)__cxa_allocate_exception(0x1010);
  poVar1 = std::operator<<(local_198,
                           "Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is "
                          );
  print_hierarchy_abi_cxx11_(&local_1c8,this);
  std::operator<<(poVar1,(string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  compare_fails_exception::compare_fails_exception(this_00,local_1e8);
  __cxa_throw(this_00,&compare_fails_exception::typeinfo,
              compare_fails_exception::~compare_fails_exception);
}

Assistant:

void EOFActual() {
        std::stringstream ss;
        throw compare_fails_exception((ss
            << "Unexpected EOF reading ACTUAL.\nCurrent position in scene hierarchy is "
            << print_hierarchy(),ss.str().c_str()
            ));
    }